

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatUtils.h
# Opt level: O0

void xSAT_UtilSort(void **pArray,int nSize,_func_int_void_ptr_void_ptr *CompFnct)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int local_38;
  int local_34;
  int j;
  int i;
  void *pTmp;
  void *pPivot;
  _func_int_void_ptr_void_ptr *CompFnct_local;
  int nSize_local;
  void **pArray_local;
  
  if (nSize < 0x10) {
    xSAT_UtilSelectSort(pArray,nSize,CompFnct);
  }
  else {
    pvVar1 = pArray[nSize / 2];
    local_34 = -1;
    local_38 = nSize;
    while( true ) {
      do {
        local_34 = local_34 + 1;
        iVar3 = (*CompFnct)(pArray[local_34],pvVar1);
      } while (iVar3 != 0);
      do {
        local_38 = local_38 + -1;
        iVar3 = (*CompFnct)(pvVar1,pArray[local_38]);
      } while (iVar3 != 0);
      if (local_38 <= local_34) break;
      pvVar2 = pArray[local_34];
      pArray[local_34] = pArray[local_38];
      pArray[local_38] = pvVar2;
    }
    xSAT_UtilSort(pArray,local_34,CompFnct);
    xSAT_UtilSort(pArray + local_34,nSize - local_34,CompFnct);
  }
  return;
}

Assistant:

static void xSAT_UtilSort( void** pArray, int nSize, int(* CompFnct )( const void *, const void *) )
{
    if ( nSize <= 15 )
        xSAT_UtilSelectSort( pArray, nSize, CompFnct );
    else
    {
        void* pPivot = pArray[nSize / 2];
        void* pTmp;
        int i = -1;
        int j = nSize;

        for(;;)
        {
            do i++; while( CompFnct( pArray[i], pPivot ) );
            do j--; while( CompFnct( pPivot, pArray[j] ) );

            if ( i >= j )
                break;

            pTmp = pArray[i];
            pArray[i] = pArray[j];
            pArray[j] = pTmp;
        }

        xSAT_UtilSort( pArray, i, CompFnct );
        xSAT_UtilSort( pArray + i, ( nSize - i ), CompFnct );
    }
}